

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

int SSL_get_verify_callback(int param_1,X509_STORE_CTX *param_2)

{
  SSL_CONFIG *pSVar1;
  undefined4 in_register_0000003c;
  
  bssl::check_ssl_x509_method((SSL *)CONCAT44(in_register_0000003c,param_1));
  pSVar1 = (((SSL *)CONCAT44(in_register_0000003c,param_1))->config)._M_t.
           super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
  if (pSVar1 != (SSL_CONFIG *)0x0) {
    return (int)pSVar1->verify_callback;
  }
  __assert_fail("ssl->config",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                ,0x1da,"int (*SSL_get_verify_callback(const SSL *))(int, X509_STORE_CTX *)");
}

Assistant:

int (*SSL_get_verify_callback(const SSL *ssl))(int, X509_STORE_CTX *) {
  check_ssl_x509_method(ssl);
  if (!ssl->config) {
    assert(ssl->config);
    return 0;
  }
  return ssl->config->verify_callback;
}